

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void burn_object(void *arg,long timeout)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_180;
  char *local_170;
  bool local_135;
  bool local_134;
  long how_long;
  char whose [256];
  xchar y;
  xchar x;
  boolean need_newsym;
  boolean menorah;
  boolean many;
  obj *poStack_20;
  boolean canseeit;
  obj *obj;
  long timeout_local;
  void *arg_local;
  
  whose[0xfd] = *(short *)((long)arg + 0x2a) == 0x10b;
  if ((bool)whose[0xfd]) {
    local_134 = '\x01' < *(char *)((long)arg + 0x34);
  }
  else {
    local_134 = 1 < *(int *)((long)arg + 0x30);
  }
  whose[0xfe] = local_134;
  if (timeout != (ulong)moves) {
    if ((long)((ulong)moves - timeout) < (long)*(int *)((long)arg + 0x5c)) {
      *(int *)((long)arg + 0x5c) = *(int *)((long)arg + 0x5c) - (int)((ulong)moves - timeout);
      begin_burn(level,(obj *)arg,'\x01');
      return;
    }
    *(undefined4 *)((long)arg + 0x5c) = 0;
    end_burn((obj *)arg,'\0');
    if (whose[0xfd] != '\0') {
      *(undefined1 *)((long)arg + 0x34) = 0;
      iVar3 = weight((obj *)arg);
      *(int *)((long)arg + 0x2c) = iVar3;
      if (*(char *)((long)arg + 0x48) != '\x03') {
        return;
      }
      encumber_msg();
      return;
    }
    if (((*(short *)((long)arg + 0x2a) != 0xe5) && (*(short *)((long)arg + 0x2a) != 0xe6)) &&
       (*(short *)((long)arg + 0x2a) != 0x142)) {
      return;
    }
    obj_extract_self((obj *)arg);
    obfree((obj *)arg,(obj *)0x0);
    return;
  }
  bVar2 = get_obj_location((obj *)arg,whose + 0xfb,whose + 0xfa,0);
  if (bVar2 == '\0') {
    whose[0xff] = '\0';
  }
  else {
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((local_135 = false, ublindf != (obj *)0x0 &&
        (local_135 = false, ublindf->oartifact == '\x1d')))) {
      local_135 = (viz_array[whose[0xfa]][whose[0xfb]] & 2U) != 0;
    }
    whose[0xff] = local_135;
    Shk_Your((char *)&how_long,(obj *)arg);
  }
  whose[0xfc] = '\0';
  iVar3 = (int)*(short *)((long)arg + 0x2a);
  if (1 < iVar3 - 0xe5U) {
    if (iVar3 - 0xe7U < 2) {
      iVar3 = *(int *)((long)arg + 0x5c);
      if (iVar3 == 0) {
        if ((whose[0xff] != '\0') || (*(char *)((long)arg + 0x48) == '\x03')) {
          cVar1 = *(char *)((long)arg + 0x48);
          if (cVar1 == '\x01') {
            if (*(short *)((long)arg + 0x2a) == 0xe7) {
              pline("You see a lantern run out of power.");
            }
            else {
              pcVar4 = xname((obj *)arg);
              an(pcVar4);
              pline("You see %s go out.");
            }
            *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
          }
          else if (cVar1 == '\x03' || cVar1 == '\x04') {
            if (*(short *)((long)arg + 0x2a) == 0xe7) {
              pline("%s lantern has run out of power.");
            }
            else {
              pcVar4 = xname((obj *)arg);
              pline("%s %s has gone out.",&how_long,pcVar4);
            }
            *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
          }
        }
        end_burn((obj *)arg,'\0');
      }
      else if (iVar3 == 0x19) {
        if (whose[0xff] != '\0') {
          if (*(short *)((long)arg + 0x2a) == 0xe7) {
            lantern_message((obj *)arg);
          }
          else {
            cVar1 = *(char *)((long)arg + 0x48);
            if (cVar1 == '\x01') {
              pcVar4 = xname((obj *)arg);
              pcVar4 = an(pcVar4);
              pline("You see %s about to go out.",pcVar4);
              *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
            }
            else if (cVar1 == '\x03' || cVar1 == '\x04') {
              pcVar4 = xname((obj *)arg);
              pline("%s %s seems about to go out.",&how_long,pcVar4);
              *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
            }
          }
        }
      }
      else if ((((iVar3 == 0x32) || (iVar3 == 100)) || (iVar3 == 0x96)) && (whose[0xff] != '\0')) {
        if (*(short *)((long)arg + 0x2a) == 0xe7) {
          lantern_message((obj *)arg);
        }
        else {
          pcVar4 = "";
          if (*(int *)((long)arg + 0x5c) == 0x32) {
            pcVar4 = " considerably";
          }
          see_lamp_flicker((obj *)arg,pcVar4);
        }
      }
      if ((arg != (void *)0x0) && (*(int *)((long)arg + 0x5c) != 0)) {
        begin_burn(level,(obj *)arg,'\x01');
      }
      goto LAB_003002bb;
    }
    if (iVar3 != 0x10b) {
      if (iVar3 == 0x142) {
        if (whose[0xff] != '\0') {
          cVar1 = *(char *)((long)arg + 0x48);
          if (cVar1 == '\x01') {
            pline("You see a burning potion of oil go out.");
            whose[0xfc] = '\x01';
          }
          else if (cVar1 == '\x03' || cVar1 == '\x04') {
            pline("%s potion of oil has burnt away.");
          }
        }
        end_burn((obj *)arg,'\0');
        obj_extract_self((obj *)arg);
        obfree((obj *)arg,(obj *)0x0);
      }
      else {
        pcVar4 = xname((obj *)arg);
        warning("burn_object: unexpeced obj %s",pcVar4);
      }
      goto LAB_003002bb;
    }
  }
  iVar3 = *(int *)((long)arg + 0x5c);
  poStack_20 = (obj *)arg;
  if (iVar3 == 0) {
    if ((whose[0xff] != '\0') || (*(char *)((long)arg + 0x48) == '\x03')) {
      if (whose[0xfd] == '\0') {
        cVar1 = *(char *)((long)arg + 0x48);
        if (cVar1 == '\x01') {
          pcVar4 = "";
          if (whose[0xfe] == '\0') {
            pcVar5 = xname((obj *)arg);
            local_1a0 = an(pcVar5);
          }
          else {
            pcVar4 = "some ";
            local_1a0 = xname((obj *)arg);
          }
          pline("You see %s%s consumed!",pcVar4,local_1a0);
          whose[0xfc] = '\x01';
          *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
        }
        else if (cVar1 == '\x03' || cVar1 == '\x04') {
          pcVar4 = xname((obj *)arg);
          pcVar5 = "is";
          if (whose[0xfe] != '\0') {
            pcVar5 = "are";
          }
          pline("%s %s %s consumed!",&how_long,pcVar4,pcVar5);
          *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            local_1b0 = "Its flame dies.";
            if (whose[0xfe] != '\0') {
              local_1b0 = "Their flames die.";
            }
          }
          else {
            local_1b0 = "";
          }
          local_1a8 = local_1b0;
        }
        else {
          local_1a8 = "It shrieks!";
          if (whose[0xfe] != '\0') {
            local_1a8 = "They shriek!";
          }
        }
        pline(local_1a8);
      }
      else {
        cVar1 = *(char *)((long)arg + 0x48);
        if (cVar1 == '\x01') {
          pline("You see a candelabrum\'s flame%s die.");
          *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
        }
        else if (cVar1 == '\x03' || cVar1 == '\x04') {
          pcVar4 = " dies";
          if (whose[0xfe] != '\0') {
            pcVar4 = "s die";
          }
          pline("%s candelabrum\'s flame%s.",&how_long,pcVar4);
          *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
        }
      }
    }
    end_burn((obj *)arg,'\0');
    if (whose[0xfd] == '\0') {
      obj_extract_self((obj *)arg);
      obfree((obj *)arg,(obj *)0x0);
      poStack_20 = (obj *)0x0;
    }
    else {
      *(undefined1 *)((long)arg + 0x34) = 0;
      iVar3 = weight((obj *)arg);
      *(int *)((long)arg + 0x2c) = iVar3;
      if (*(char *)((long)arg + 0x48) == '\x03') {
        encumber_msg();
      }
    }
  }
  else if (iVar3 == 0xf) {
    if (whose[0xff] != '\0') {
      cVar1 = *(char *)((long)arg + 0x48);
      if (cVar1 == '\x01') {
        if (whose[0xfd] == '\0') {
          local_180 = "a ";
          if (whose[0xfe] != '\0') {
            local_180 = "some ";
          }
        }
        else {
          local_180 = "a candelabrum\'s ";
        }
        pcVar4 = "\'s";
        if (whose[0xfe] != '\0') {
          pcVar4 = "s\'";
        }
        pcVar5 = "";
        if (whose[0xfe] != '\0') {
          pcVar5 = "s";
        }
        pline("You see %scandle%s flame%s flicker low!",local_180,pcVar4,pcVar5);
        *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
      }
      else if (cVar1 == '\x03' || cVar1 == '\x04') {
        pcVar4 = "\n\n";
        if (whose[0xfd] != '\0') {
          pcVar4 = "a candelabrum\'s ";
        }
        pcVar5 = "\'s";
        if (whose[0xfe] != '\0') {
          pcVar5 = "s\'";
        }
        pcVar6 = "";
        if (whose[0xfe] != '\0') {
          pcVar6 = "s";
        }
        pcVar7 = "s";
        if (whose[0xfe] != '\0') {
          pcVar7 = "";
        }
        pline("%s %scandle%s flame%s flicker%s low!",&how_long,pcVar4 + 2,pcVar5,pcVar6,pcVar7);
        *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
      }
    }
  }
  else if ((iVar3 == 0x4b) && (whose[0xff] != '\0')) {
    cVar1 = *(char *)((long)arg + 0x48);
    if (cVar1 == '\x01') {
      if (whose[0xfd] == '\0') {
        local_170 = "a ";
        if (whose[0xfe] != '\0') {
          local_170 = "some ";
        }
      }
      else {
        local_170 = "a candelabrum\'s ";
      }
      pcVar4 = "";
      if (whose[0xfe] != '\0') {
        pcVar4 = "s";
      }
      pline("You see %scandle%s getting short.",local_170,pcVar4);
      *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
    }
    else if (cVar1 == '\x03' || cVar1 == '\x04') {
      pcVar4 = "\n\n";
      if (whose[0xfd] != '\0') {
        pcVar4 = "a candelabrum\'s ";
      }
      pcVar5 = " is";
      if (whose[0xfe] != '\0') {
        pcVar5 = "s are";
      }
      pline("%s %scandle%s getting short.",&how_long,pcVar4 + 2,pcVar5);
      *(uint *)((long)arg + 0x4a) = *(uint *)((long)arg + 0x4a) & 0xffffffef | 0x10;
    }
  }
  if ((poStack_20 != (obj *)0x0) && (poStack_20->age != 0)) {
    begin_burn(level,poStack_20,'\x01');
  }
LAB_003002bb:
  if (whose[0xfc] != '\0') {
    newsym((int)whose[0xfb],(int)whose[0xfa]);
  }
  return;
}

Assistant:

void burn_object(void *arg, long timeout)
{
	struct obj *obj = (struct obj *) arg;
	boolean canseeit, many, menorah, need_newsym;
	xchar x, y;
	char whose[BUFSZ];

	menorah = obj->otyp == CANDELABRUM_OF_INVOCATION;
	many = menorah ? obj->spe > 1 : obj->quan > 1L;

	/* timeout while away */
	if (timeout != moves) {
	    long how_long = moves - timeout;

	    if (how_long >= obj->age) {
		obj->age = 0;
		end_burn(obj, FALSE);

		if (menorah) {
		    obj->spe = 0;	/* no more candles */
		    obj->owt = weight(obj);
		    if (carried(obj)) encumber_msg();
		} else if (Is_candle(obj) || obj->otyp == POT_OIL) {
		    /* get rid of candles and burning oil potions */
		    obj_extract_self(obj);
		    obfree(obj, NULL);
		    obj = NULL;
		}

	    } else {
		obj->age -= how_long;
		begin_burn(level, obj, TRUE);
	    }
	    return;
	}

	/* only interested in INVENT, FLOOR, and MINVENT */
	if (get_obj_location(obj, &x, &y, 0)) {
	    canseeit = !Blind && cansee(x, y);
	    /* set up `whose[]' to be "Your" or "Fred's" or "The goblin's" */
	    Shk_Your(whose, obj);
	} else {
	    canseeit = FALSE;
	}
	need_newsym = FALSE;

	/* obj->age is the age remaining at this point.  */
	switch (obj->otyp) {
	    case POT_OIL:
		    /* this should only be called when we run out */
		    if (canseeit) {
			switch (obj->where) {
			    case OBJ_INVENT:
			    case OBJ_MINVENT:
				pline("%s potion of oil has burnt away.",
				    whose);
				break;
			    case OBJ_FLOOR:
				pline("You see a burning potion of oil go out.");
				need_newsym = TRUE;
				break;
			}
		    }
		    end_burn(obj, FALSE);	/* turn off light source */
		    obj_extract_self(obj);
		    obfree(obj, NULL);
		    obj = NULL;
		    break;

	    case BRASS_LANTERN:
	    case OIL_LAMP:
		switch((int)obj->age) {
		    case 150:
		    case 100:
		    case 50:
			if (canseeit) {
			    if (obj->otyp == BRASS_LANTERN)
				lantern_message(obj);
			    else
				see_lamp_flicker(obj,
				    obj->age == 50L ? " considerably" : "");
			}
			break;

		    case 25:
			if (canseeit) {
			    if (obj->otyp == BRASS_LANTERN)
				lantern_message(obj);
			    else {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s %s seems about to go out.",
					    whose, xname(obj));
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					pline("You see %s about to go out.",
					    an(xname(obj)));
					obj->known = 1;
					break;
				}
			    }
			}
			break;

		    case 0:
			/* even if blind you'll know if holding it */
			if (canseeit || obj->where == OBJ_INVENT) {
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    if (obj->otyp == BRASS_LANTERN)
					pline("%s lantern has run out of power.",
					    whose);
				    else
					pline("%s %s has gone out.",
					    whose, xname(obj));
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    if (obj->otyp == BRASS_LANTERN)
					pline("You see a lantern run out of power.");
				    else
					pline("You see %s go out.",
					    an(xname(obj)));
				    obj->known = 1;
				    break;
			    }
			}
			end_burn(obj, FALSE);
			break;

		    default:
			/*
			 * Someone added fuel to the lamp while it was
			 * lit.  Just fall through and let begin burn
			 * handle the new age.
			 */
			break;
		}

		if (obj && obj->age)
		    begin_burn(level, obj, TRUE);

		break;

	    case CANDELABRUM_OF_INVOCATION:
	    case TALLOW_CANDLE:
	    case WAX_CANDLE:
		switch (obj->age) {
		    case 75:
			if (canseeit)
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    pline("%s %scandle%s getting short.",
					whose,
					menorah ? "candelabrum's " : "",
					many ? "s are" : " is");
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    pline("You see %scandle%s getting short.",
					    menorah ? "a candelabrum's " :
						many ? "some " : "a ",
					    many ? "s" : "");
				    obj->known = 1;
				    break;
			    }
			break;

		    case 15:
			if (canseeit)
			    switch (obj->where) {
				case OBJ_INVENT:
				case OBJ_MINVENT:
				    pline(
					"%s %scandle%s flame%s flicker%s low!",
					    whose,
					    menorah ? "candelabrum's " : "",
					    many ? "s'" : "'s",
					    many ? "s" : "",
					    many ? "" : "s");
				    obj->known = 1;
				    break;
				case OBJ_FLOOR:
				    pline("You see %scandle%s flame%s flicker low!",
					    menorah ? "a candelabrum's " :
						many ? "some " : "a ",
					    many ? "s'" : "'s",
					    many ? "s" : "");
				    obj->known = 1;
				    break;
			    }
			break;

		    case 0:
			/* we know even if blind and in our inventory */
			if (canseeit || obj->where == OBJ_INVENT) {
			    if (menorah) {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s candelabrum's flame%s.",
					    whose,
					    many ? "s die" : " dies");
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					pline("You see a candelabrum's flame%s die.",
						many ? "s" : "");
					obj->known = 1;
					break;
				}
			    } else {
				switch (obj->where) {
				    case OBJ_INVENT:
				    case OBJ_MINVENT:
					pline("%s %s %s consumed!",
					    whose,
					    xname(obj),
					    many ? "are" : "is");
					obj->known = 1;
					break;
				    case OBJ_FLOOR:
					/*
					You see some wax candles consumed!
					You see a wax candle consumed!
					*/
					pline("You see %s%s consumed!",
					    many ? "some " : "",
					    many ? xname(obj):an(xname(obj)));
					need_newsym = TRUE;
					obj->known = 1;
					break;
				}

				/* post message */
				pline(Hallucination ?
					(many ? "They shriek!" :
						"It shrieks!") :
					Blind ? "" :
					    (many ? "Their flames die." :
						    "Its flame dies."));
			    }
			}
			end_burn(obj, FALSE);

			if (menorah) {
			    obj->spe = 0;
			    obj->owt = weight(obj); /* no more candles */
			    if (carried(obj)) encumber_msg();
			} else {
			    obj_extract_self(obj);
			    obfree(obj, NULL);
			    obj = NULL;
			}
			break;

		    default:
			/*
			 * Someone added fuel (candles) to the menorah while
			 * it was lit.  Just fall through and let begin burn
			 * handle the new age.
			 */
			break;
		}

		if (obj && obj->age)
		    begin_burn(level, obj, TRUE);

		break;

	    default:
		warning("burn_object: unexpeced obj %s", xname(obj));
		break;
	}
	if (need_newsym) newsym(x, y);
}